

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_portability_unit.c
# Opt level: O0

void test_deserialize(char *filename)

{
  char *x;
  char *buf;
  char *y;
  char *file;
  size_t actual_size;
  char *output_buffer;
  size_t expected_size;
  roaring_bitmap_t *bitmap;
  char *input_buffer;
  undefined8 in_stack_ffffffffffffffc8;
  int iVar1;
  roaring_bitmap_t *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  char *a;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  x = readfile(in_stack_ffffffffffffffe0);
  _assert_true((unsigned_long)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (char *)in_stack_ffffffffffffffd0,iVar1);
  roaring_bitmap_portable_deserialize((char *)0x102b0f);
  _assert_true((unsigned_long)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (char *)in_stack_ffffffffffffffd0,iVar1);
  buf = (char *)roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x102b3b);
  a = buf;
  filesize((char *)in_stack_ffffffffffffffd0);
  _assert_int_equal((unsigned_long)a,(unsigned_long)in_stack_ffffffffffffffd8,
                    (char *)in_stack_ffffffffffffffd0,(int)((ulong)buf >> 0x20));
  y = (char *)malloc((size_t)a);
  file = (char *)roaring_bitmap_portable_serialize(in_stack_ffffffffffffffd0,buf);
  iVar1 = (int)((ulong)buf >> 0x20);
  _assert_int_equal((unsigned_long)a,(unsigned_long)y,file,iVar1);
  compare(x,y,(size_t)file);
  _assert_true((unsigned_long)a,y,file,iVar1);
  free(y);
  free(x);
  roaring_bitmap_free((roaring_bitmap_t *)0x102c06);
  return;
}

Assistant:

static inline void test_deserialize(char* filename) {
    char* input_buffer = readfile(filename);
    assert_non_null(input_buffer);

    roaring_bitmap_t* bitmap =
        roaring_bitmap_portable_deserialize(input_buffer);
    assert_non_null(bitmap);

    size_t expected_size = roaring_bitmap_portable_size_in_bytes(bitmap);

    assert_int_equal(expected_size, filesize(filename));

    char* output_buffer = (char*)malloc(expected_size);
    size_t actual_size =
        roaring_bitmap_portable_serialize(bitmap, output_buffer);

    assert_int_equal(actual_size, expected_size);
    assert_false(compare(input_buffer, output_buffer, actual_size));

    free(output_buffer);
    free(input_buffer);
    roaring_bitmap_free(bitmap);
}